

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::piece_picker::is_hashing(piece_picker *this,piece_index_t piece)

{
  uint uVar1;
  download_queue_t queue;
  iterator iVar2;
  
  uVar1 = *(uint *)((this->m_piece_map).
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + piece.m_val);
  queue.m_val = (byte)(uVar1 >> 0x1a) & 7;
  if (queue.m_val == 5) {
    queue.m_val = '\0';
  }
  else if ((uVar1 >> 0x1a & 7) == 6) {
    queue.m_val = '\x01';
  }
  if (queue.m_val == '\x04') {
    return false;
  }
  iVar2 = find_dl_piece(this,queue,piece);
  return SUB21((ushort)*(undefined2 *)&(iVar2._M_current)->field_0xa >> 0xf,0);
}

Assistant:

bool piece_picker::is_hashing(piece_index_t const piece) const
	{
		piece_pos const& p = m_piece_map[piece];
		auto const state = p.download_queue();
		if (state == piece_pos::piece_open)
			return false;
		auto const i = find_dl_piece(state, piece);
		TORRENT_ASSERT(i != m_downloads[state].end());
		return i->hashing > 0;
	}